

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::seekValueCase
          (CppGenerator *this,size_t depth,string *rel_name,string *attr_name,bool parallel)

{
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R9B;
  undefined1 in_stack_0000107f;
  size_t in_stack_00001080;
  string *in_stack_00001088;
  string *in_stack_00001090;
  CppGenerator *in_stack_00001098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  CppGenerator *in_stack_fffffffffffff598;
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [23];
  undefined1 in_stack_fffffffffffff617;
  size_t in_stack_fffffffffffff618;
  string *in_stack_fffffffffffff620;
  CppGenerator *in_stack_fffffffffffff628;
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [48];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [39];
  byte local_29;
  string *local_20;
  
  local_29 = in_R9B & 1;
  __lhs = in_RDI;
  local_20 = in_RCX;
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::string(local_8e0,local_20);
  getUpperPointer(in_stack_fffffffffffff628,in_stack_fffffffffffff620,in_stack_fffffffffffff618,
                  (bool)in_stack_fffffffffffff617);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  genFindUpperBound(in_stack_00001098,in_stack_00001090,in_stack_00001088,in_stack_00001080,
                    (bool)in_stack_0000107f);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff598);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffff598,(size_t)in_stack_fffffffffffff590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_a80);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_a60);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_a20);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_a00);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff620);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_9a0);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_940);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3f0);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string(local_900);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::~string(local_490);
  std::__cxx11::string::~string(local_4b0);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string(local_4d0);
  std::__cxx11::string::~string(local_4f0);
  std::__cxx11::string::~string(local_510);
  std::__cxx11::string::~string(local_530);
  std::__cxx11::string::~string(local_550);
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_590);
  std::__cxx11::string::~string(local_5b0);
  std::__cxx11::string::~string(local_880);
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::string::~string(local_5f0);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_610);
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_650);
  std::__cxx11::string::~string(local_670);
  std::__cxx11::string::~string(local_690);
  std::__cxx11::string::~string(local_6b0);
  std::__cxx11::string::~string(local_840);
  std::__cxx11::string::~string(local_6d0);
  std::__cxx11::string::~string(local_6f0);
  std::__cxx11::string::~string(local_710);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_770);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_7b0);
  std::__cxx11::string::~string(local_7d0);
  std::__cxx11::string::~string(local_7f0);
  return __lhs;
}

Assistant:

std::string CppGenerator::seekValueCase(size_t depth, const std::string& rel_name,
                                        const std::string& attr_name,
                                        bool parallel)
{
    return offset(4+depth)+"case "+rel_name+"_ID:\n"+
        //if
        offset(5+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(6+depth)+"found["+std::to_string(depth)+"] = true;\n"+
        // else if 
        offset(5+depth)+"else if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(6+depth)+"atEnd["+std::to_string(depth)+"] = true;\n"+
        //else 
        offset(5+depth)+"else\n"+offset(5+depth)+"{\n"+
        /* Calling genFindUpperBound Function */
        genFindUpperBound(rel_name,attr_name,depth, parallel)+
        // offset(6+depth)+"findUpperBound("+rel_name+",&"+rel_name+"_tuple::"+
        // attr_name+", max_"+attr_name+",lowerptr_"+rel_name+"["+
        // std::to_string(depth)+"],"+getUpperPointer(rel_name,depth,parallel)+");\n"+
        offset(6+depth)+"max_"+attr_name+" = "+rel_name+"[lowerptr_"+
        rel_name+"["+std::to_string(depth)+"]]."+attr_name+";\n"+
        offset(6+depth)+"rel["+std::to_string(depth)+"] = (rel["+
        std::to_string(depth)+"]+1) % numOfRel["+std::to_string(depth)+"];\n"+
        offset(5+depth)+"}\n"+
        //break
        offset(5+depth)+"break;\n";
}